

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall
fasttext::FastText::supervised
          (FastText *this,Model *model,real lr,vector<int,_std::allocator<int>_> *line,
          vector<int,_std::allocator<int>_> *labels,int32_t id)

{
  result_type_conflict1 targetIndex;
  ulong uVar1;
  uniform_int_distribution<int> uniform;
  uniform_int_distribution<int> local_28;
  
  uVar1 = (long)(labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar1 != 0) &&
     ((line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     )) {
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loss
        == ova) {
      Model::update(model,line,labels,-1,lr,id);
      return;
    }
    local_28._M_param._M_b = (int)(uVar1 >> 2) + -1;
    local_28._M_param._M_a = 0;
    targetIndex = std::uniform_int_distribution<int>::operator()
                            (&local_28,&model->rng,&local_28._M_param);
    Model::update(model,line,labels,targetIndex,lr,id);
  }
  return;
}

Assistant:

void FastText::supervised(
		Model& model,
		real lr,
		const std::vector<int32_t>& line,
		const std::vector<int32_t>& labels,
		int32_t id) {
	if (labels.size() == 0 || line.size() == 0) {
		return;
	}
	if (args_->loss == loss_name::ova) {
		model.update(line, labels, Model::kAllLabelsAsTarget, lr,id);
	} else {
		std::uniform_int_distribution<> uniform(0, labels.size() - 1);
		int32_t i = uniform(model.rng);
		model.update(line, labels, i, lr,id);
	}
}